

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   error_code *ec,int *error_pos,int depth_limit,int token_limit)

{
  _func_int *p_Var1;
  long lVar2;
  vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  *pvVar3;
  int iVar4;
  uint uVar5;
  libtorrent *plVar6;
  ulong uVar7;
  pointer pbVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  bdecode_token bVar12;
  libtorrent lVar13;
  char *pcVar14;
  uint uVar15;
  bdecode_node *this_00;
  libtorrent *plVar16;
  libtorrent *plVar17;
  libtorrent *plVar18;
  void *__s;
  int iVar19;
  libtorrent *plVar20;
  uint uVar21;
  ulong uVar22;
  undefined8 uStack_a0;
  ulong local_98;
  char *local_90;
  bdecode_token local_88;
  ulong local_80;
  ulong local_78;
  bdecode_token local_70;
  libtorrent *local_68;
  ulong *local_60;
  void *local_58;
  bdecode_token local_50;
  bdecode_token local_48;
  libtorrent *local_40;
  bdecode_node *local_38;
  
  puVar10 = (ulong *)buffer.m_len;
  pcVar14 = buffer.m_ptr;
  local_40 = this;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->m_root_tokens + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->m_tokens).
    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    .
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar3 = &(__return_storage_ptr__->m_tokens).
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ;
  (pvVar3->
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->m_token_idx = -1;
  __return_storage_ptr__->m_last_index = -1;
  __return_storage_ptr__->m_last_token = -1;
  __return_storage_ptr__->m_size = -1;
  *(undefined4 *)puVar10 = 0;
  *(undefined1 *)((long)puVar10 + 4) = 0;
  puVar10[1] = (ulong)&boost::system::detail::cat_holder<void>::system_category_instance;
  local_38 = __return_storage_ptr__;
  if (0x1fffffff < (long)pcVar14) {
    if (ec != (error_code *)0x0) {
      ec->val_ = 0;
    }
    if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
       (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
      uStack_a0 = 0x18d22b;
      iVar4 = (*bdecode_category::bdecode_category.super_error_category._vptr_error_category[6])
                        (&bdecode_category::bdecode_category,6);
      uVar11 = 6;
      __return_storage_ptr__ = local_38;
      if ((char)iVar4 == '\0') goto LAB_0018d246;
    }
    uVar11 = 0x100000006;
    local_38 = __return_storage_ptr__;
LAB_0018d246:
    *puVar10 = uVar11;
    puVar10[1] = (ulong)&bdecode_category::bdecode_category;
    return local_38;
  }
  iVar4 = (int)error_pos;
  local_78 = CONCAT44(local_78._4_4_,iVar4);
  lVar2 = -((long)iVar4 * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_98 + lVar2);
  if (iVar4 != 0) {
    *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d28d;
    memset(__s,0,(long)iVar4 << 2);
  }
  if (pcVar14 != (char *)0x0) {
    local_90 = pcVar14;
    plVar16 = local_40 + (long)pcVar14;
    local_88 = (bdecode_token)0x1a0000000;
    local_98 = (ulong)(1 - (int)local_40);
    uVar5 = 0;
    local_68 = plVar16;
    local_58 = __s;
    local_50 = (bdecode_token)ec;
    local_60 = puVar10;
    plVar18 = local_40;
    this_00 = local_38;
    do {
      ec = (error_code *)local_50;
      plVar17 = plVar18;
      if (plVar16 < plVar18) {
LAB_0018da2e:
        plVar18 = plVar17;
        if (0 < (int)uVar5) {
LAB_0018da37:
          local_68 = (libtorrent *)((long)plVar18 - (long)local_40);
          uVar11 = (ulong)((uint)((long)plVar18 - (long)local_40) & 0x1fffffff);
          local_70 = (bdecode_token)(uVar11 | 0x220000000);
          local_50 = (bdecode_token)(uVar11 + 0xa0000000);
          local_88 = (bdecode_token)((ulong)local_88 | uVar11);
          uVar11 = (ulong)uVar5 + 1;
          do {
            uVar5 = *(uint *)((long)__s + uVar11 * 4 + -8);
            uVar15 = uVar5 & 0x7fffffff;
            pbVar8 = (this_00->m_tokens).
                     super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     .
                     super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar12 = pbVar8[uVar15];
            if (((int)uVar5 < 0) && ((bVar12._0_4_ & 0xe0000000) == 0x20000000)) {
              local_48 = local_70;
              local_78 = (ulong)uVar5;
              *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dab4;
              std::
              vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
              ::emplace_back<libtorrent::detail::bdecode_token>
                        ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          *)this_00,&local_48);
              local_48 = local_50;
              *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18daca;
              std::
              vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
              ::emplace_back<libtorrent::detail::bdecode_token>
                        ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          *)this_00,&local_48);
              pbVar8 = (this_00->m_tokens).
                       super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       .
                       super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar12 = pbVar8[uVar15];
              uVar5 = (uint)local_78;
              __s = local_58;
            }
            pbVar8[uVar15] =
                 (bdecode_token)
                 ((ulong)bVar12 & 0xe0000000ffffffff |
                 (ulong)(((uint)(*(int *)&(this_00->m_tokens).
                                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                          .
                                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (int)pbVar8)
                         >> 3) - uVar5 & 0x1fffffff) << 0x20);
            local_48 = local_88;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18db18;
            std::
            vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ::emplace_back<libtorrent::detail::bdecode_token>
                      ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        *)this_00,&local_48);
            uVar11 = uVar11 - 1;
            local_48 = local_50;
            this_00 = local_38;
          } while (1 < uVar11);
          goto LAB_0018dc42;
        }
        break;
      }
      iVar4 = (int)plVar18;
      if (plVar16 <= plVar18) {
        if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
           (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
          p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d926;
          iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,3);
          uVar11 = 3;
          this_00 = local_38;
          if ((char)iVar19 == '\0') goto LAB_0018da12;
        }
        uVar11 = 0x100000003;
LAB_0018da12:
        *puVar10 = uVar11;
        puVar10[1] = (ulong)&bdecode_category::bdecode_category;
        if (local_50 != (bdecode_token)0x0) {
          *(int *)local_50 = iVar4 - (int)local_40;
        }
        goto LAB_0018da2e;
      }
      if ((int)local_78 <= (int)uVar5) {
        if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
           (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
          p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d990;
          iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,5);
          uVar11 = 5;
          this_00 = local_38;
          if ((char)iVar19 == '\0') goto LAB_0018da12;
        }
        uVar11 = 0x100000005;
        goto LAB_0018da12;
      }
      if (depth_limit < 1) {
        if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
           (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
          p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d9f4;
          iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,6);
          uVar11 = 6;
          this_00 = local_38;
          if ((char)iVar19 == '\0') goto LAB_0018da12;
        }
        uVar11 = 0x100000006;
        goto LAB_0018da12;
      }
      lVar13 = *plVar18;
      if ((((0 < (int)uVar5) &&
           (uVar15 = *(uint *)((long)__s + (ulong)uVar5 * 4 + -4), -1 < (int)uVar15)) &&
          ((SUB84((this_00->m_tokens).
                  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                  .
                  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15 & 0x7fffffff],0) & 0xe0000000) ==
           0x20000000)) && (lVar13 != (libtorrent)0x65 && 9 < (byte)((char)lVar13 - 0x30U))) {
        if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
           (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018dbac:
          uVar11 = 0x100000001;
        }
        else {
          p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18db8e;
          iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,1);
          uVar11 = 1;
          this_00 = local_38;
          if ((char)iVar19 != '\0') goto LAB_0018dbac;
        }
LAB_0018de45:
        *puVar10 = uVar11;
        puVar10[1] = (ulong)&bdecode_category::bdecode_category;
        if (local_50 != (bdecode_token)0x0) {
          *(int *)local_50 = iVar4 - (int)local_40;
        }
        goto LAB_0018da37;
      }
      uVar15 = uVar5;
      switch(lVar13) {
      case (libtorrent)0x64:
        local_70._0_4_ = depth_limit;
        *(uint *)((long)__s + (long)(int)uVar5 * 4) =
             (uint)((ulong)((long)(this_00->m_tokens).
                                  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  .
                                  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->m_tokens).
                                 super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                 .
                                 super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) & 0x7fffffff;
        local_48 = (bdecode_token)((ulong)(iVar4 - (int)local_40 & 0x1fffffff) | 0x20000000);
        *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d3b1;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)this_00,&local_48);
        break;
      case (libtorrent)0x65:
        if (uVar5 != 0) {
          if (((0 < (int)uVar5) &&
              (uVar15 = *(uint *)((long)__s + (ulong)uVar5 * 4 + -4), (int)uVar15 < 0)) &&
             ((SUB84((this_00->m_tokens).
                     super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     .
                     super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15 & 0x7fffffff],0) & 0xe0000000)
              == 0x20000000)) {
            if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b)
               && (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d
                  )) {
              p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category
                       [6];
              *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18de27;
              iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,4);
              uVar11 = 4;
              this_00 = local_38;
              if ((char)iVar19 == '\0') goto LAB_0018de45;
            }
            uVar11 = 0x100000004;
            goto LAB_0018de45;
          }
          local_70._0_4_ = depth_limit;
          uVar21 = iVar4 - (int)local_40;
          local_48 = (bdecode_token)((ulong)(uVar21 & 0x1fffffff) | 0x1a0000000);
          local_80 = (ulong)uVar5;
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d4c6;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)this_00,&local_48);
          uVar15 = (uint)local_80;
          uVar5 = *(uint *)((long)__s + (long)(int)uVar15 * 4 + -4);
          uVar9 = uVar5 & 0x7fffffff;
          pbVar8 = (this_00->m_tokens).
                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   .
                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (int)((ulong)((long)(this_00->m_tokens).
                                      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                      .
                                      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) >>
                       3);
          if ((int)(iVar4 - uVar9) < 0x20000000) {
            pbVar8[uVar9] =
                 (bdecode_token)
                 ((ulong)pbVar8[uVar9] & 0xe0000000ffffffff |
                 (ulong)(iVar4 - uVar5 & 0x1fffffff) << 0x20);
            plVar18 = plVar18 + 1;
            puVar10 = local_60;
            uVar5 = uVar15 - 1;
            goto LAB_0018d58a;
          }
          uVar5 = uVar15;
          if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
             (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018ddbb:
            uVar11 = 0x100000006;
          }
          else {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dda0;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,6);
            uVar5 = (uint)local_80;
            uVar11 = 6;
            this_00 = local_38;
            if ((char)iVar4 != '\0') goto LAB_0018ddbb;
          }
          *local_60 = uVar11;
          local_60[1] = (ulong)&bdecode_category::bdecode_category;
          if ((bdecode_token)ec != (bdecode_token)0x0) {
            *(uint *)ec = uVar21;
          }
          goto LAB_0018da2e;
        }
        if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
           (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018dc09:
          uVar11 = 0x100000003;
        }
        else {
          p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dbf6;
          iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,3);
          uVar11 = 3;
          this_00 = local_38;
          if ((char)iVar19 != '\0') goto LAB_0018dc09;
        }
        *puVar10 = uVar11;
        puVar10[1] = (ulong)&bdecode_category::bdecode_category;
        if ((bdecode_token)ec != (bdecode_token)0x0) {
          iVar4 = iVar4 - (int)local_40;
          goto LAB_0018d795;
        }
        goto LAB_0018dc29;
      default:
        if (9 < (byte)((char)lVar13 - 0x30U)) {
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dcc7;
            iVar19 = (*p_Var1)(&bdecode_category::bdecode_category,4);
            uVar11 = 4;
            this_00 = local_38;
            if ((char)iVar19 == '\0') goto LAB_0018da12;
          }
          uVar11 = 0x100000004;
          goto LAB_0018da12;
        }
        plVar17 = plVar18 + 1;
        if (plVar16 <= plVar17) {
          if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
             (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018dd42:
            uVar11 = 0x100000003;
          }
          else {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dd2f;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,3);
            uVar11 = 3;
            this_00 = local_38;
            if ((char)iVar4 != '\0') goto LAB_0018dd42;
          }
          *puVar10 = uVar11;
          puVar10[1] = (ulong)&bdecode_category::bdecode_category;
LAB_0018dfd7:
          __s = local_58;
          if ((bdecode_token)ec != (bdecode_token)0x0) {
            ec->val_ = (int)plVar17 - (int)local_40;
          }
          goto LAB_0018da2e;
        }
        uVar11 = (ulong)(byte)((char)lVar13 - 0x30U);
        iVar19 = (int)local_98 + iVar4;
        do {
          uVar7 = (ulong)(byte)*plVar17;
          plVar6 = plVar17;
          if (uVar7 == 0x3a) break;
          if (9 < (byte)((char)*plVar17 - 0x30U)) {
            uVar22 = 1;
LAB_0018d859:
            if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b)
               || (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d
                  )) {
LAB_0018d8a4:
              uVar11 = 0x100000000;
            }
            else {
              p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category
                       [6];
              *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d895;
              iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,uVar22);
              this_00 = local_38;
              if ((char)iVar4 != '\0') goto LAB_0018d8a4;
              uVar11 = 0;
            }
            *local_60 = uVar22 | uVar11;
            local_60[1] = (ulong)&bdecode_category::bdecode_category;
            __s = local_58;
            if (local_50 != (bdecode_token)0x0) {
              *(int *)local_50 = iVar19;
            }
            goto LAB_0018da2e;
          }
          uVar22 = 7;
          if ((0xccccccccccccccc < (long)uVar11) ||
             ((long)(-0x7fffffffffffffd1 - uVar7) < (long)(uVar11 * 10))) goto LAB_0018d859;
          uVar11 = (uVar11 * 10 + uVar7) - 0x30;
          plVar17 = plVar17 + 1;
          iVar19 = iVar19 + 1;
          plVar6 = plVar16;
        } while (plVar17 != plVar16);
        if (plVar6 == plVar16) {
          plVar17 = plVar16;
          if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
             (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018ded0:
            uVar11 = 0x100000002;
          }
          else {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18deb9;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,2);
            uVar11 = 2;
            this_00 = local_38;
            plVar17 = local_68;
            if ((char)iVar4 != '\0') goto LAB_0018ded0;
          }
          *local_60 = uVar11;
          local_60[1] = (ulong)&bdecode_category::bdecode_category;
          __s = local_58;
          if ((bdecode_token)ec != (bdecode_token)0x0) {
            ec->val_ = (int)local_90;
          }
          goto LAB_0018da2e;
        }
        if ((long)(plVar16 + ~(ulong)plVar6) < (long)uVar11) {
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18df4b;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,3);
            uVar11 = 3;
            this_00 = local_38;
            if ((char)iVar4 == '\0') goto LAB_0018dfc5;
          }
          uVar11 = 0x100000003;
LAB_0018dfc5:
          *local_60 = uVar11;
          local_60[1] = (ulong)&bdecode_category::bdecode_category;
          plVar17 = plVar6;
          goto LAB_0018dfd7;
        }
        if ((long)uVar11 < 0) {
          if ((bdecode_category::bdecode_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
             (bdecode_category::bdecode_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dfae;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,7);
            uVar11 = 7;
            this_00 = local_38;
            if ((char)iVar4 == '\0') goto LAB_0018dfc5;
          }
          uVar11 = 0x100000007;
          goto LAB_0018dfc5;
        }
        plVar17 = plVar6 + 1;
        if (9 < (long)plVar17 - (long)plVar18) {
          if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
             (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018e047:
            uVar11 = 0x100000006;
          }
          else {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18e037;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,6);
            uVar11 = 6;
            this_00 = local_38;
            if ((char)iVar4 != '\0') goto LAB_0018e047;
          }
          *local_60 = uVar11;
          local_60[1] = (ulong)&bdecode_category::bdecode_category;
          __s = local_58;
          if ((bdecode_token)ec != (bdecode_token)0x0) {
            ec->val_ = (int)plVar17 - (int)local_40;
          }
          goto LAB_0018da2e;
        }
        local_48 = (bdecode_token)
                   (((long)plVar17 - (long)plVar18 << 0x3d) + 0xc000000000000000U |
                   (ulong)(iVar4 - (int)local_40 & 0x1fffffff) | 0x160000000);
        *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d6f5;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)this_00,&local_48);
        plVar18 = plVar17 + uVar11;
        this_00 = local_38;
        __s = local_58;
        puVar10 = local_60;
        goto LAB_0018d592;
      case (libtorrent)0x69:
        plVar6 = plVar18 + 1;
        uVar11 = 3;
        plVar20 = plVar16;
        if (plVar6 == plVar16) {
LAB_0018d7ce:
          if (local_50 != (bdecode_token)0x0) {
            *(int *)local_50 = (int)plVar20 - (int)local_40;
          }
          if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
             (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018d836:
            uVar7 = 0x100000000;
          }
          else {
            p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6]
            ;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d81a;
            iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,uVar11);
            this_00 = local_38;
            if ((char)iVar4 != '\0') goto LAB_0018d836;
            uVar7 = 0;
          }
          *puVar10 = uVar11 | uVar7;
          puVar10[1] = (ulong)&bdecode_category::bdecode_category;
          goto LAB_0018da2e;
        }
        lVar13 = *plVar6;
        if (lVar13 == (libtorrent)0x2d) {
          plVar6 = plVar18 + 2;
          if (plVar6 == plVar16) goto LAB_0018d7ce;
          lVar13 = *plVar6;
        }
        uVar9 = 0;
        plVar18 = plVar6 + 1;
        do {
          plVar20 = plVar18;
          puVar10 = local_60;
          if (9 < (byte)((char)lVar13 - 0x30U)) {
            plVar20 = plVar20 + -1;
            iVar4 = -uVar9;
            uVar15 = 1;
LAB_0018d7b7:
            uVar11 = 7;
            if (iVar4 < 0x15) {
              uVar11 = (ulong)uVar15;
            }
            goto LAB_0018d7ce;
          }
          if (plVar20 == plVar16) {
            iVar4 = (int)plVar16 - (int)plVar6;
            uVar15 = 3;
            plVar20 = plVar16;
            goto LAB_0018d7b7;
          }
          lVar13 = *plVar20;
          uVar9 = uVar9 - 1;
          plVar18 = plVar20 + 1;
        } while (lVar13 != (libtorrent)0x65);
        if (uVar9 < 0xffffffec) {
          uVar11 = 7;
          goto LAB_0018d7ce;
        }
        local_70._0_4_ = depth_limit;
        local_48 = (bdecode_token)((ulong)(iVar4 - (int)local_40 & 0x1fffffff) | 0x180000000);
        *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d447;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)this_00,&local_48);
        this_00 = local_38;
        puVar10 = local_60;
        goto LAB_0018d58a;
      case (libtorrent)0x6c:
        local_70._0_4_ = depth_limit;
        *(uint *)((long)__s + (long)(int)uVar5 * 4) =
             (uint)((ulong)((long)(this_00->m_tokens).
                                  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  .
                                  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->m_tokens).
                                 super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                 .
                                 super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) & 0x7fffffff;
        local_48 = (bdecode_token)((ulong)(iVar4 - (int)local_40 & 0x1fffffff) | 0x40000000);
        *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d579;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)this_00,&local_48);
      }
      this_00 = local_38;
      plVar18 = plVar18 + 1;
      uVar5 = uVar5 + 1;
LAB_0018d58a:
      depth_limit = local_70._0_4_;
LAB_0018d592:
      plVar16 = local_68;
      if (0 < (int)uVar15) {
        uVar9 = *(uint *)((long)__s + (ulong)uVar15 * 4 + -4);
        if (((ulong)(this_00->m_tokens).
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9 & 0x7fffffff] & 0xe0000000) ==
            0x20000000) {
          *(uint *)((long)__s + (ulong)uVar15 * 4 + -4) = uVar9 + 0x80000000;
        }
      }
      depth_limit = depth_limit + -1;
    } while (uVar5 != 0);
    goto LAB_0018dc29;
  }
  if ((bdecode_category::bdecode_category.super_error_category.id_ == 0x8fafd21e25c5e09b) ||
     (bdecode_category::bdecode_category.super_error_category.id_ == 0xb2ab117a257edf0d)) {
LAB_0018d775:
    uVar11 = 0x100000003;
  }
  else {
    p_Var1 = bdecode_category::bdecode_category.super_error_category._vptr_error_category[6];
    *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18d765;
    iVar4 = (*p_Var1)(&bdecode_category::bdecode_category,3);
    uVar11 = 3;
    if ((char)iVar4 != '\0') goto LAB_0018d775;
  }
  *puVar10 = uVar11;
  puVar10[1] = (ulong)&bdecode_category::bdecode_category;
  iVar4 = 0;
  plVar18 = local_40;
  this_00 = local_38;
  if (ec != (error_code *)0x0) {
LAB_0018d795:
    ec->val_ = iVar4;
  }
LAB_0018dc29:
  local_68 = (libtorrent *)((long)plVar18 - (long)local_40);
  local_48 = (bdecode_token)((ulong)((uint)local_68 & 0x1fffffff) + 0xa0000000);
LAB_0018dc42:
  *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18dc51;
  std::vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::emplace_back<libtorrent::detail::bdecode_token>
            ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
              *)this_00,&local_48);
  this_00->m_token_idx = 0;
  this_00->m_buffer = (char *)local_40;
  this_00->m_buffer_size = (int)local_68;
  this_00->m_root_tokens =
       (this_00->m_tokens).
       super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
       .
       super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  return this_00;
}

Assistant:

bdecode_node bdecode(span<char const> buffer
		, error_code& ec, int* error_pos, int depth_limit, int token_limit)
	{
		bdecode_node ret;
		ec.clear();

		if (buffer.size() > bdecode_token::max_offset)
		{
			if (error_pos) *error_pos = 0;
			ec = bdecode_errors::limit_exceeded;
			return ret;
		}

		// this is the stack of bdecode_token indices, into m_tokens.
		// sp is the stack pointer, as index into the array, stack
		int sp = 0;
		TORRENT_ALLOCA(stack, stack_frame, depth_limit);

		// TODO: 2 attempt to simplify this implementation by embracing the span
		char const* start = buffer.data();
		char const* end = start + buffer.size();
		char const* const orig_start = start;

		if (start == end)
			TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

		while (start <= end)
		{
			if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

			if (sp >= depth_limit)
				TORRENT_FAIL_BDECODE(bdecode_errors::depth_exceeded);

			--token_limit;
			if (token_limit < 0)
				TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

			// look for a new token
			char const t = *start;

			int const current_frame = sp;

			// if we're currently parsing a dictionary, assert that
			// every other node is a string.
			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				if (stack[current_frame - 1].state == 0)
				{
					// the current parent is a dict and we are parsing a key.
					// only allow a digit (for a string) or 'e' to terminate
					if (!numeric(t) && t != 'e')
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_digit);
				}
			}

			switch (t)
			{
				case 'd':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the dictionary in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::dict});
					++start;
					break;
				case 'l':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the list in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::list});
					++start;
					break;
				case 'i':
				{
					char const* const int_start = start;
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					// +1 here to point to the first digit, rather than 'i'
					start = check_integer(start + 1, end, e);
					if (e)
					{
						// in order to gracefully terminate the tree,
						// make sure the end of the previous token is set correctly
						if (error_pos) *error_pos = int(start - orig_start);
						error_pos = nullptr;
						start = int_start;
						TORRENT_FAIL_BDECODE(e);
					}
					ret.m_tokens.push_back({int_start - orig_start
						, 1, bdecode_token::integer, 1});
					TORRENT_ASSERT(*start == 'e');

					// skip 'e'
					++start;
					break;
				}
				case 'e':
				{
					// this is the end of a list or dict
					if (sp == 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

					if (sp > 0
						&& ret.m_tokens[stack[sp - 1].token].type == bdecode_token::dict
						&& stack[sp - 1].state == 1)
					{
						// this means we're parsing a dictionary and about to parse a
						// value associated with a key. Instead, we got a termination
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);
					}

					// insert the end-of-sequence token
					ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});

					// and back-patch the start of this sequence with the offset
					// to the next token we'll insert
					int const top = stack[sp - 1].token;
					// subtract the token's own index, since this is a relative
					// offset
					if (int(ret.m_tokens.size()) - top > bdecode_token::max_next_item)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);

					// and pop it from the stack.
					TORRENT_ASSERT(sp > 0);
					--sp;
					++start;
					break;
				}
				default:
				{
					// this is the case for strings. The start character is any
					// numeric digit
					if (!numeric(t))
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);

					std::int64_t len = t - '0';
					char const* const str_start = start;
					++start;
					if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					start = parse_int(start, end, ':', len, e);
					if (e)
						TORRENT_FAIL_BDECODE(e);
					if (start == end)
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_colon);

					// remaining buffer size excluding ':'
					ptrdiff_t const buff_size = end - start - 1;
					if (len > buff_size)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					if (len < 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::overflow);

					// skip ':'
					++start;
					// no need to range check start here
					// the check above ensures that the buffer is long enough to hold
					// the string's length which guarantees that start <= end

					// the bdecode_token only has 8 bits to keep the header size
					// in. If it overflows, fail!
					if (start - str_start - 2 > detail::bdecode_token::max_header)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens.push_back({str_start - orig_start
						, 1, bdecode_token::string, std::uint8_t(start - str_start)});
					start += len;
					break;
				}
			}

			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				// the next item we parse is the opposite
				// state is an unsigned 1-bit member. adding 1 will flip the bit
				stack[current_frame - 1].state = (stack[current_frame - 1].state + 1) & 1;
			}

			// this terminates the top level node, we're done!
			if (sp == 0) break;
		}

done:

		// if parse failed, sp will be greater than 1
		// unwind the stack by inserting terminator to make whatever we have
		// so far valid
		while (sp > 0) {
			TORRENT_ASSERT(ec);
			--sp;

			// we may need to insert a dummy token to properly terminate the tree,
			// in case we just parsed a key to a dict and failed in the value
			if (ret.m_tokens[stack[sp].token].type == bdecode_token::dict
				&& stack[sp].state == 1)
			{
				// insert an empty dictionary as the value
				ret.m_tokens.push_back({start - orig_start, 2, bdecode_token::dict});
				ret.m_tokens.push_back({start - orig_start, bdecode_token::end});
			}

			int const top = stack[sp].token;
			TORRENT_ASSERT(int(ret.m_tokens.size()) - top <= bdecode_token::max_next_item);
			ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);
			ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});
		}

		ret.m_tokens.push_back({start - orig_start, 0, bdecode_token::end});

		ret.m_token_idx = 0;
		ret.m_buffer = orig_start;
		ret.m_buffer_size = int(start - orig_start);
		ret.m_root_tokens = ret.m_tokens.data();

		return ret;
	}